

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_util.hpp
# Opt level: O2

string * __thiscall
rest_rpc::get_error_msg_abi_cxx11_(string *__return_storage_ptr__,rest_rpc *this,string_view result)

{
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> tp;
  msgpack_codec codec;
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tStack_58;
  msgpack_codec local_30;
  
  local_30.msg_.m_obj.super_object.type = NIL;
  local_30.msg_.m_zone._M_t.
  super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>._M_t.
  super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>.
  super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl =
       (__uniq_ptr_data<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>,_true,_true>)
       (__uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>)0x0;
  rpc_service::msgpack_codec::unpack<std::tuple<int,std::__cxx11::string>>
            (&tStack_58,&local_30,(char *)this,(size_t)result.data_);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tStack_58);
  std::__cxx11::string::~string((string *)&tStack_58);
  std::unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>::~unique_ptr
            (&local_30.msg_.m_zone);
  return __return_storage_ptr__;
}

Assistant:

inline std::string get_error_msg(string_view result) {
  rpc_service::msgpack_codec codec;
  auto tp =
      codec.unpack<std::tuple<int, std::string>>(result.data(), result.size());
  return std::get<1>(tp);
}